

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spgmr.c
# Opt level: O1

int SUNLinSolSetATimes_SPGMR(SUNLinearSolver S,void *ATData,SUNATimesFn ATimes)

{
  void *pvVar1;
  
  if (S != (SUNLinearSolver)0x0) {
    pvVar1 = S->content;
    *(SUNATimesFn *)((long)pvVar1 + 0x28) = ATimes;
    *(void **)((long)pvVar1 + 0x30) = ATData;
    *(undefined4 *)((long)pvVar1 + 0x20) = 0;
    return 0;
  }
  return -0x321;
}

Assistant:

int SUNLinSolSetATimes_SPGMR(SUNLinearSolver S, void* ATData,
                             SUNATimesFn ATimes)
{
  /* set function pointers to integrator-supplied ATimes routine
     and data, and return with success */
  if (S == NULL) return(SUNLS_MEM_NULL);
  SPGMR_CONTENT(S)->ATimes = ATimes;
  SPGMR_CONTENT(S)->ATData = ATData;
  LASTFLAG(S) = SUNLS_SUCCESS;
  return(LASTFLAG(S));
}